

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QJsonValue *o)

{
  Type TVar1;
  QCborValue *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_fffffffffffffed8;
  char in_stack_fffffffffffffedf;
  QJsonValue *in_stack_fffffffffffffee0;
  QString *in_stack_fffffffffffffee8;
  QDebug *in_stack_fffffffffffffef0;
  QJsonValue *in_stack_fffffffffffffef8;
  QDebugStateSaver *in_stack_ffffffffffffff00;
  QJsonValue *in_stack_ffffffffffffff08;
  QJsonArray *in_stack_ffffffffffffff28;
  QDebug *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  QDebug local_50 [3];
  QDebug local_38 [5];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff00,(QDebug *)in_stack_fffffffffffffef8);
  TVar1 = QCborValue::type(in_RDX);
  if (TVar1 == Integer) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QJsonValue::toInteger(in_stack_fffffffffffffef8,(qint64)in_stack_fffffffffffffef0);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,
                       CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  }
  else if (TVar1 == String) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QJsonValue::toString(in_stack_ffffffffffffff08);
    in_stack_fffffffffffffef0 =
         QDebug::operator<<(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
    QString::~QString((QString *)0x4a3429);
  }
  else if (TVar1 == Array) {
    in_stack_fffffffffffffee8 = (QString *)QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QDebug::QDebug(local_38,in_RSI);
    QJsonValue::toArray(in_stack_ffffffffffffff08);
    operator<<(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QDebug::~QDebug((QDebug *)in_stack_ffffffffffffff28);
    QJsonArray::~QJsonArray((QJsonArray *)0x4a34e6);
    QDebug::~QDebug((QDebug *)in_stack_ffffffffffffff28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  }
  else if (TVar1 == Map) {
    in_stack_fffffffffffffee0 = (QJsonValue *)QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QDebug::QDebug(local_50,in_RSI);
    QJsonValue::toObject(in_stack_ffffffffffffff08);
    operator<<(in_stack_ffffffffffffff30,(QJsonObject *)in_stack_ffffffffffffff28);
    QDebug::~QDebug((QDebug *)in_stack_ffffffffffffff28);
    QJsonObject::~QJsonObject((QJsonObject *)0x4a35eb);
    QDebug::~QDebug((QDebug *)in_stack_ffffffffffffff28);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  }
  else if ((uint)(TVar1 + 0xfffffeec) < 2) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QJsonValue::toBool((QJsonValue *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                       false);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  }
  else if (TVar1 == Null) {
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
  }
  else if (TVar1 == Undefined) {
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
  }
  else if (TVar1 == Double) {
    QDebug::nospace(in_RSI);
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff38);
    QJsonValue::toDouble
              (in_stack_fffffffffffffee0,
               (double)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,
                       (double)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
  }
  QDebug::QDebug(in_stack_fffffffffffffef0,(QDebug *)in_stack_fffffffffffffee8);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_fffffffffffffee0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug dbg, const QJsonValue &o)
{
    QDebugStateSaver saver(dbg);
    switch (o.value.type()) {
    case QCborValue::Undefined:
        dbg << "QJsonValue(undefined)";
        break;
    case QCborValue::Null:
        dbg << "QJsonValue(null)";
        break;
    case QCborValue::True:
    case QCborValue::False:
        dbg.nospace() << "QJsonValue(bool, " << o.toBool() << ')';
        break;
    case QCborValue::Integer:
        dbg.nospace() << "QJsonValue(double, " << o.toInteger() << ')';
        break;
    case QCborValue::Double:
        dbg.nospace() << "QJsonValue(double, " << o.toDouble() << ')';
        break;
    case QCborValue::String:
        dbg.nospace() << "QJsonValue(string, " << o.toString() << ')';
        break;
    case QCborValue::Array:
        dbg.nospace() << "QJsonValue(array, ";
        dbg << o.toArray();
        dbg << ')';
        break;
    case QCborValue::Map:
        dbg.nospace() << "QJsonValue(object, ";
        dbg << o.toObject();
        dbg << ')';
        break;
    default:
        Q_UNREACHABLE();
    }
    return dbg;
}